

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

int __thiscall
ON_wString::Compare(ON_wString *this,ON_wString *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  int iVar1;
  int element_count2;
  wchar_t *string1;
  wchar_t *string2;
  
  string1 = operator_cast_to_wchar_t_(this);
  iVar1 = Length(this);
  string2 = operator_cast_to_wchar_t_(other_string);
  element_count2 = Length(other_string);
  iVar1 = Compare(string1,iVar1,string2,element_count2,locale,bIgnoreCase);
  return iVar1;
}

Assistant:

int ON_wString::Compare(
  const ON_wString& other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_wString::Compare(
    static_cast< const wchar_t* >(*this),
    this->Length(),
    static_cast< const wchar_t* >(other_string),
    other_string.Length(),
    locale,
    bIgnoreCase
    );
}